

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O2

stack_st_TRUST_TOKEN_PRETOKEN *
voprf_blind(VOPRF_METHOD *method,CBB *cbb,size_t count,int include_message,uint8_t *msg,
           size_t msg_len)

{
  EC_SCALAR *r_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  EC_GROUP *group;
  OPENSSL_STACK *sk;
  TRUST_TOKEN_PRETOKEN *pretoken;
  size_t sVar9;
  bool bVar10;
  EC_SCALAR r;
  EC_JACOBIAN Tp;
  EC_JACOBIAN P;
  SHA512_CTX hash_ctx;
  
  group = (*method->group_func)();
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    while( true ) {
      bVar10 = count == 0;
      count = count - 1;
      if (bVar10) {
        return (stack_st_TRUST_TOKEN_PRETOKEN *)sk;
      }
      pretoken = (TRUST_TOKEN_PRETOKEN *)OPENSSL_malloc(0x158);
      if ((pretoken == (TRUST_TOKEN_PRETOKEN *)0x0) ||
         (sVar9 = OPENSSL_sk_push(sk,pretoken), sVar9 == 0)) break;
      RAND_bytes((uchar *)pretoken,0x40);
      if (include_message == 0) {
        uVar1 = *(undefined8 *)pretoken->salt;
        uVar2 = *(undefined8 *)(pretoken->salt + 8);
        uVar3 = *(undefined8 *)(pretoken->salt + 0x10);
        uVar4 = *(undefined8 *)(pretoken->salt + 0x18);
        uVar5 = *(undefined8 *)(pretoken->salt + 0x20);
        uVar6 = *(undefined8 *)(pretoken->salt + 0x28);
        uVar7 = *(undefined8 *)(pretoken->salt + 0x38);
        *(undefined8 *)(pretoken->t + 0x30) = *(undefined8 *)(pretoken->salt + 0x30);
        *(undefined8 *)(pretoken->t + 0x38) = uVar7;
        *(undefined8 *)(pretoken->t + 0x20) = uVar5;
        *(undefined8 *)(pretoken->t + 0x28) = uVar6;
        *(undefined8 *)(pretoken->t + 0x10) = uVar3;
        *(undefined8 *)(pretoken->t + 0x18) = uVar4;
        *(undefined8 *)pretoken->t = uVar1;
        *(undefined8 *)(pretoken->t + 8) = uVar2;
      }
      else {
        SHA512_Init((SHA512_CTX *)&hash_ctx);
        SHA512_Update((SHA512_CTX *)&hash_ctx,pretoken,0x40);
        SHA512_Update((SHA512_CTX *)&hash_ctx,msg,msg_len);
        SHA512_Final(pretoken->t,(SHA512_CTX *)&hash_ctx);
      }
      iVar8 = ec_random_nonzero_scalar(group,&r,"");
      if (iVar8 == 0) goto LAB_0040a922;
      r_00 = &pretoken->r;
      ec_scalar_inv0_montgomery(group,r_00,&r);
      ec_scalar_from_montgomery(group,&r,&r);
      ec_scalar_from_montgomery(group,r_00,r_00);
      iVar8 = (*method->hash_to_group)(group,&P,pretoken->t);
      if ((iVar8 == 0) || (iVar8 = ec_point_mul_scalar(group,&Tp,&P,&r), iVar8 == 0))
      goto LAB_0040a922;
      iVar8 = ec_jacobian_to_affine(group,&pretoken->Tp,&Tp);
      if ((iVar8 == 0) || (iVar8 = cbb_add_point(cbb,group,&pretoken->Tp), iVar8 == 0))
      goto LAB_0040a922;
    }
    TRUST_TOKEN_PRETOKEN_free(pretoken);
  }
LAB_0040a922:
  sk_TRUST_TOKEN_PRETOKEN_pop_free((stack_st_TRUST_TOKEN_PRETOKEN *)sk,TRUST_TOKEN_PRETOKEN_free);
  return (stack_st_TRUST_TOKEN_PRETOKEN *)0x0;
}

Assistant:

static STACK_OF(TRUST_TOKEN_PRETOKEN) *voprf_blind(const VOPRF_METHOD *method,
                                                   CBB *cbb, size_t count,
                                                   int include_message,
                                                   const uint8_t *msg,
                                                   size_t msg_len) {
  SHA512_CTX hash_ctx;

  const EC_GROUP *group = method->group_func();
  STACK_OF(TRUST_TOKEN_PRETOKEN) *pretokens =
      sk_TRUST_TOKEN_PRETOKEN_new_null();
  if (pretokens == NULL) {
    goto err;
  }

  for (size_t i = 0; i < count; i++) {
    // Insert |pretoken| into |pretokens| early to simplify error-handling.
    TRUST_TOKEN_PRETOKEN *pretoken = reinterpret_cast<TRUST_TOKEN_PRETOKEN *>(
        OPENSSL_malloc(sizeof(TRUST_TOKEN_PRETOKEN)));
    if (pretoken == NULL ||
        !sk_TRUST_TOKEN_PRETOKEN_push(pretokens, pretoken)) {
      TRUST_TOKEN_PRETOKEN_free(pretoken);
      goto err;
    }

    RAND_bytes(pretoken->salt, sizeof(pretoken->salt));
    if (include_message) {
      assert(SHA512_DIGEST_LENGTH == TRUST_TOKEN_NONCE_SIZE);
      SHA512_Init(&hash_ctx);
      SHA512_Update(&hash_ctx, pretoken->salt, sizeof(pretoken->salt));
      SHA512_Update(&hash_ctx, msg, msg_len);
      SHA512_Final(pretoken->t, &hash_ctx);
    } else {
      OPENSSL_memcpy(pretoken->t, pretoken->salt, TRUST_TOKEN_NONCE_SIZE);
    }

    // We sample r in Montgomery form to simplify inverting.
    EC_SCALAR r;
    if (!ec_random_nonzero_scalar(group, &r, kDefaultAdditionalData)) {
      goto err;
    }

    // pretoken->r is rinv.
    ec_scalar_inv0_montgomery(group, &pretoken->r, &r);
    // Convert both out of Montgomery form.
    ec_scalar_from_montgomery(group, &r, &r);
    ec_scalar_from_montgomery(group, &pretoken->r, &pretoken->r);

    // Tp is the blinded token in the VOPRF protocol.
    EC_JACOBIAN P, Tp;
    if (!method->hash_to_group(group, &P, pretoken->t) ||
        !ec_point_mul_scalar(group, &Tp, &P, &r) ||
        !ec_jacobian_to_affine(group, &pretoken->Tp, &Tp)) {
      goto err;
    }

    if (!cbb_add_point(cbb, group, &pretoken->Tp)) {
      goto err;
    }
  }

  return pretokens;

err:
  sk_TRUST_TOKEN_PRETOKEN_pop_free(pretokens, TRUST_TOKEN_PRETOKEN_free);
  return NULL;
}